

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlParseCharRef(htmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  xmlParserErrors xVar3;
  byte *pbVar4;
  bool bVar5;
  int val;
  xmlParserInputPtr pxVar6;
  char *msg;
  uint uVar7;
  
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (pxVar6 = ctxt->input, pxVar6 == (xmlParserInputPtr)0x0))
  {
    msg = "htmlParseCharRef: context error\n";
    xVar3 = XML_ERR_INTERNAL_ERROR;
LAB_00149910:
    htmlParseErr(ctxt,xVar3,msg,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  else {
    pxVar2 = pxVar6->cur;
    if ((*pxVar2 == '&') && (pxVar2[1] == '#')) {
      if ((pxVar2[2] | 0x20) == 0x78) {
        pbVar4 = pxVar2 + 3;
        pxVar6->cur = pbVar4;
        pxVar6->col = pxVar6->col + 3;
        uVar7 = 0;
        while( true ) {
          val = (int)pxVar6;
          bVar1 = *pbVar4;
          if (bVar1 == 0x3b) break;
          pxVar6 = (xmlParserInputPtr)(ulong)(bVar1 - 0x30);
          if (9 < (byte)(bVar1 - 0x30)) {
            pxVar6 = (xmlParserInputPtr)(ulong)(bVar1 - 0x61);
            if ((byte)(bVar1 - 0x61) < 6) {
              if ((int)uVar7 < 0x110000) {
                uVar7 = (uVar7 * 0x10 + (uint)bVar1) - 0x57;
              }
              goto LAB_001498f2;
            }
            pxVar6 = (xmlParserInputPtr)(ulong)(bVar1 - 0x41);
            if ((byte)(bVar1 - 0x41) < 6) {
              if ((int)uVar7 < 0x110000) {
                uVar7 = (uVar7 * 0x10 + (uint)bVar1) - 0x37;
              }
              goto LAB_001498f2;
            }
            xVar3 = XML_ERR_INVALID_HEX_CHARREF;
LAB_001499b2:
            val = 0;
            htmlParseErr(ctxt,xVar3,"htmlParseCharRef: missing semicolon\n",(xmlChar *)0x0,
                         (xmlChar *)0x0);
            if (*ctxt->input->cur == ';') break;
            goto LAB_001499d5;
          }
          if ((int)uVar7 < 0x110000) {
            uVar7 = (uVar7 * 0x10 + (uint)bVar1) - 0x30;
          }
LAB_001498f2:
          xmlNextChar(ctxt);
          pbVar4 = ctxt->input->cur;
        }
      }
      else {
        pbVar4 = pxVar2 + 2;
        pxVar6->cur = pbVar4;
        pxVar6->col = pxVar6->col + 2;
        uVar7 = 0;
        while( true ) {
          val = (int)pxVar6;
          bVar1 = *pbVar4;
          if (bVar1 == 0x3b) break;
          if (9 < (byte)(bVar1 - 0x30)) {
            xVar3 = XML_ERR_INVALID_DEC_CHARREF;
            goto LAB_001499b2;
          }
          pxVar6 = (xmlParserInputPtr)(ulong)(uVar7 * 10);
          if ((int)uVar7 < 0x110000) {
            uVar7 = (uVar7 * 10 - 0x30) + (uint)bVar1;
          }
          xmlNextChar(ctxt);
          pbVar4 = ctxt->input->cur;
        }
      }
      xmlNextChar(ctxt);
LAB_001499d5:
      if ((int)uVar7 < 0x100) {
        if (0x1f < (int)uVar7) {
          return uVar7;
        }
        if ((uVar7 < 0xe) && ((0x2600U >> (uVar7 & 0x1f) & 1) != 0)) {
          return uVar7;
        }
      }
      else {
        bVar5 = uVar7 - 0xe000 < 0x1ffe || uVar7 < 0xd800;
        val = CONCAT31((int3)(uVar7 - 0xe000 >> 8),bVar5);
        if (uVar7 - 0x10000 < 0x100000 || bVar5) {
          return uVar7;
        }
        if (0x10ffff < uVar7) {
          msg = "htmlParseCharRef: value too large\n";
          xVar3 = XML_ERR_INVALID_CHAR;
          goto LAB_00149910;
        }
      }
    }
    else {
      uVar7 = 0;
      val = 0;
      htmlParseErr(ctxt,XML_ERR_INVALID_CHARREF,"htmlParseCharRef: invalid value\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
    }
    htmlParseErrInt(ctxt,0x1e7885,(char *)(ulong)uVar7,val);
  }
  return 0;
}

Assistant:

int
htmlParseCharRef(htmlParserCtxtPtr ctxt) {
    int val = 0;

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseCharRef: context error\n",
		     NULL, NULL);
        return(0);
    }
    if ((CUR == '&') && (NXT(1) == '#') &&
        ((NXT(2) == 'x') || NXT(2) == 'X')) {
	SKIP(3);
	while (CUR != ';') {
	    if ((CUR >= '0') && (CUR <= '9')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - '0');
            } else if ((CUR >= 'a') && (CUR <= 'f')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - 'a') + 10;
            } else if ((CUR >= 'A') && (CUR <= 'F')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - 'A') + 10;
            } else {
	        htmlParseErr(ctxt, XML_ERR_INVALID_HEX_CHARREF,
		             "htmlParseCharRef: missing semicolon\n",
			     NULL, NULL);
		break;
	    }
	    NEXT;
	}
	if (CUR == ';')
	    NEXT;
    } else if  ((CUR == '&') && (NXT(1) == '#')) {
	SKIP(2);
	while (CUR != ';') {
	    if ((CUR >= '0') && (CUR <= '9')) {
                if (val < 0x110000)
	            val = val * 10 + (CUR - '0');
            } else {
	        htmlParseErr(ctxt, XML_ERR_INVALID_DEC_CHARREF,
		             "htmlParseCharRef: missing semicolon\n",
			     NULL, NULL);
		break;
	    }
	    NEXT;
	}
	if (CUR == ';')
	    NEXT;
    } else {
	htmlParseErr(ctxt, XML_ERR_INVALID_CHARREF,
	             "htmlParseCharRef: invalid value\n", NULL, NULL);
    }
    /*
     * Check the value IS_CHAR ...
     */
    if (IS_CHAR(val)) {
        return(val);
    } else if (val >= 0x110000) {
	htmlParseErr(ctxt, XML_ERR_INVALID_CHAR,
		     "htmlParseCharRef: value too large\n", NULL, NULL);
    } else {
	htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
			"htmlParseCharRef: invalid xmlChar value %d\n",
			val);
    }
    return(0);
}